

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datastructure.h
# Opt level: O0

bool next_combination<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_long>
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                index,unsigned_long k,unsigned_long n)

{
  uint uVar1;
  reference puVar2;
  ulong __n;
  ulong in_RDX;
  ulong in_RSI;
  bool bVar3;
  unsigned_long i;
  uint *last;
  ulong local_30;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_10;
  bool local_1;
  
  puVar2 = __gnu_cxx::
           __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
           ::operator[](&local_10,in_RSI - 1);
  if (*puVar2 < in_RDX) {
    if ((ulong)*puVar2 < in_RDX - 1) {
      *puVar2 = *puVar2 + 1;
      local_1 = true;
    }
    else if (in_RSI == 1) {
      local_1 = false;
    }
    else {
      local_30 = in_RSI - 2;
      while( true ) {
        bVar3 = false;
        if (local_30 != 0) {
          puVar2 = __gnu_cxx::
                   __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator[](&local_10,local_30);
          uVar1 = *puVar2;
          puVar2 = __gnu_cxx::
                   __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator[](&local_10,local_30 + 1);
          bVar3 = uVar1 == *puVar2 - 1;
        }
        if (!bVar3) break;
        local_30 = local_30 - 1;
      }
      if (local_30 == 0) {
        puVar2 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator[](&local_10,0);
        uVar1 = *puVar2;
        puVar2 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator[](&local_10,1);
        if (uVar1 == *puVar2 - 1) {
          return false;
        }
      }
      puVar2 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator[](&local_10,local_30);
      *puVar2 = *puVar2 + 1;
      while (__n = local_30 + 1, __n < in_RSI) {
        puVar2 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator[](&local_10,local_30);
        uVar1 = *puVar2;
        puVar2 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator[](&local_10,__n);
        *puVar2 = uVar1 + 1;
        local_30 = __n;
      }
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool next_combination(RandomAccessIterator index, uint k, uint n) {
    auto &last = index[k-1];
    if (last >= n) return false;
    if (last < n - 1) {
        ++last;
        return true;
    }
    if (k == 1) return false;
    uint i = k - 2;
    while (i > 0 && index[i] == index[i+1] - 1) --i;
    if (i == 0 && index[i] == index[i+1] - 1) return false;
    ++index[i];
    while (++i < k) {
        index[i] = index[i-1] + 1;
    }
    return true;
}